

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator=(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  longdouble *plVar1;
  long lVar2;
  int64_t c;
  long lVar3;
  int64_t r;
  long lVar4;
  ulong uVar5;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  
  lVar2 = (A->super_TPZBaseMatrix).fRow;
  lVar4 = (A->super_TPZBaseMatrix).fCol;
  uVar5 = lVar4 * lVar2;
  plVar1 = this->fElem;
  if (plVar1 != this->fGiven) {
    if (plVar1 != (longdouble *)0x0) {
      operator_delete__(plVar1);
    }
    this->fElem = (longdouble *)0x0;
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = lVar2;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = lVar4;
  if (this->fSize < (long)uVar5) {
    plVar1 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 * 0x10);
  }
  else {
    plVar1 = this->fGiven;
  }
  this->fElem = plVar1;
  for (lVar3 = 0; lVar3 < lVar4; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 < lVar2; lVar4 = lVar4 + 1) {
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(A,lVar4,lVar3);
      *plVar1 = in_ST0;
      plVar1 = plVar1 + 1;
      lVar2 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
    }
    lVar4 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZMatrix<TVar> &A ) {
    int64_t arows  = A.Rows();
    int64_t acols  = A.Cols();
    int64_t size = arows * acols;
    if(fElem != fGiven) {
        delete []fElem;
        fElem = 0;
    }
    this->fRow  =  arows;
    this->fCol  = acols;
    if(fSize < size) {
        fElem = new TVar[ arows * acols ] ;
    } else {
        fElem = fGiven;
    }
    TVar * dst = fElem;
    for ( int64_t c = 0; c < this->fCol; c++ )
        for ( int64_t r = 0; r < this->fRow; r++ )
            *dst++ = A.Get( r, c );
    return( *this );
}